

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O2

bool __thiscall HtmlModelSerialiser::loadModel(HtmlModelSerialiser *this,QIODevice *source)

{
  HtmlModelSerialiserPrivate *this_00;
  char cVar1;
  bool bVar2;
  QXmlStreamReader reader;
  
  if (((source != (QIODevice *)0x0) &&
      (((cVar1 = QIODevice::isOpen(), cVar1 != '\0' ||
        (cVar1 = (**(code **)(*(long *)source + 0x68))(source,1), cVar1 != '\0')) &&
       (cVar1 = QIODevice::isReadable(), cVar1 != '\0')))) &&
     (this_00 = (HtmlModelSerialiserPrivate *)
                (this->super_AbstractStringSerialiser).super_AbstractModelSerialiser.d_ptr.d,
     (this_00->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.m_model
     != (QAbstractItemModel *)0x0)) {
    QXmlStreamReader::QXmlStreamReader(&reader,source);
    bVar2 = HtmlModelSerialiserPrivate::readHtml(this_00,&reader);
    QXmlStreamReader::~QXmlStreamReader(&reader);
    return bVar2;
  }
  return false;
}

Assistant:

bool HtmlModelSerialiser::loadModel(QIODevice *source)
{
    if (!source)
        return false;
    if (!source->isOpen()) {
        if (!source->open(QIODevice::ReadOnly))
            return false;
    }
    if (!source->isReadable())
        return false;
    Q_D(HtmlModelSerialiser);

    if (!d->m_model)
        return false;
    QXmlStreamReader reader(source);
    return d->readHtml(reader);
}